

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::ContractionsAndExpansions::addStrings
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,UnicodeSet *set)

{
  short sVar1;
  bool bVar2;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  uint uVar3;
  UnicodeString s;
  UnicodeString UStack_68;
  
  if (set != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::UnicodeString(&UStack_68,&this->unreversedPrefix);
    do {
      icu_63::UnicodeString::append(&UStack_68,start);
      if (this->suffix != (UnicodeString *)0x0) {
        icu_63::UnicodeString::append(&UStack_68,this->suffix);
      }
      UnicodeSet::add(set,&UStack_68);
      sVar1 = (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar3 = (this->unreversedPrefix).fUnion.fFields.fLength;
      }
      else {
        uVar3 = (int)sVar1 >> 5;
      }
      icu_63::UnicodeString::truncate
                (&UStack_68,(char *)(ulong)uVar3,CONCAT44(extraout_var,extraout_EDX));
      bVar2 = start < end;
      start = start + 1;
    } while (bVar2);
    icu_63::UnicodeString::~UnicodeString(&UStack_68);
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::addStrings(UChar32 start, UChar32 end, UnicodeSet *set) {
    if(set == NULL) { return; }
    UnicodeString s(unreversedPrefix);
    do {
        s.append(start);
        if(suffix != NULL) {
            s.append(*suffix);
        }
        set->add(s);
        s.truncate(unreversedPrefix.length());
    } while(++start <= end);
}